

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O2

void __thiscall BitSet::BitSet(BitSet *this,unsigned_long *bits_,int nlongs)

{
  unsigned_long uVar1;
  ulong *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong __n;
  ulong uVar5;
  reference rVar6;
  allocator_type local_29;
  
  uVar3 = nlongs << 5;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->storage,(long)(int)uVar3,&local_29);
  __n = 0;
  uVar5 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar5 = __n;
  }
  for (; uVar5 != __n; __n = __n + 1) {
    uVar1 = bits_[__n >> 5 & 0x7ffffff];
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->storage,__n);
    puVar2 = rVar6._M_p;
    if (((uint)uVar1 >> ((uint)__n & 0x1f) & 1) == 0) {
      uVar4 = ~rVar6._M_mask & *puVar2;
    }
    else {
      uVar4 = rVar6._M_mask | *puVar2;
    }
    *puVar2 = uVar4;
  }
  return;
}

Assistant:

BitSet::BitSet(const unsigned long* bits_,int nlongs)
	: storage(nlongs*32)
{
	for (int i=0;i<nlongs*32;i++) {
		storage[i] = (bits_[i>>5] & (1UL << (i&31))) ? true : false;
	}
}